

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

bool __thiscall GF2::MP<6UL,_GF2::MOLex<6UL>_>::Calc(MP<6UL,_GF2::MOLex<6UL>_> *this,WW<6UL> *val)

{
  bool bVar1;
  _List_node_base *p_Var2;
  
  bVar1 = false;
  p_Var2 = (_List_node_base *)this;
  while (p_Var2 = (((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var2->_M_next)->
                  super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
                  super__List_node_base._M_next, p_Var2 != (_List_node_base *)this) {
    bVar1 = (bool)(bVar1 ^ (~*(ulong *)(p_Var2 + 1) | val->_words[0]) == 0xffffffffffffffff);
  }
  return bVar1;
}

Assistant:

bool Calc(const WW<_n>& val) const
	{
		bool ret = 0;
		for (const_iterator iter = begin(); iter != end(); ++iter)
			ret ^= iter->Calc(val);
		return ret;
	}